

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O2

int verify_table(void *buf,flatbuffers_uoffset_t end,flatbuffers_uoffset_t base,
                flatbuffers_uoffset_t offset,int ttl,flatcc_table_verifier_f *tvf)

{
  int iVar1;
  uint uVar2;
  flatcc_table_verifier_descriptor_t td;
  ulong uVar3;
  
  td.ttl = ttl + -1;
  if (td.ttl == 0) {
    iVar1 = 3;
  }
  else {
    td.table = offset + base;
    iVar1 = 0xf;
    if (base < td.table) {
      if ((td.table & 3) == 0 && (ulong)td.table + 4 <= (ulong)end) {
        uVar2 = td.table - *(int *)((long)buf + (ulong)td.table);
        uVar3 = (ulong)uVar2;
        if ((uVar2 & 1) == 0 && -1 < (int)uVar2) {
          if ((ulong)end < uVar3 + 2) {
            iVar1 = 0x1b;
          }
          else {
            td.vsize = *(ushort *)((long)buf + uVar3);
            if ((td.vsize & 1) == 0 && uVar2 + td.vsize <= end) {
              if (td.vsize < 4) {
                iVar1 = 0x1c;
              }
              else {
                td.tsize = *(ushort *)((long)buf + uVar3 + 2);
                if (end - td.table < (uint)td.tsize) {
                  iVar1 = 0x14;
                }
                else {
                  td.vtable = (void *)(uVar3 + (long)buf);
                  td.buf = buf;
                  td.end = end;
                  iVar1 = (*tvf)(&td);
                }
              }
            }
            else {
              iVar1 = 0x1e;
            }
          }
        }
        else {
          iVar1 = 0x1d;
        }
      }
    }
  }
  return iVar1;
}

Assistant:

static inline int verify_table(const void *buf, uoffset_t end, uoffset_t base, uoffset_t offset,
        int ttl, flatcc_table_verifier_f tvf)
{
    uoffset_t vbase, vend;
    flatcc_table_verifier_descriptor_t td;

    verify((td.ttl = ttl - 1), flatcc_verify_error_max_nesting_level_reached);
    verify(check_header(end, base, offset), flatcc_verify_error_table_header_out_of_range_or_unaligned);
    td.table = base + offset;
    /* Read vtable offset - it is signed, but we want it unsigned, assuming 2's complement works. */
    vbase = td.table - read_uoffset(buf, td.table);
    verify((soffset_t)vbase >= 0 && !(vbase & (voffset_size - 1)), flatcc_verify_error_vtable_offset_out_of_range_or_unaligned);
    verify(vbase + voffset_size <= end, flatcc_verify_error_vtable_header_out_of_range);
    /* Read vtable size. */
    td.vsize = read_voffset(buf, vbase);
    vend = vbase + td.vsize;
    verify(vend <= end && !(td.vsize & (voffset_size - 1)), flatcc_verify_error_vtable_size_out_of_range_or_unaligned);
    /* Optimizes away overflow check if uoffset_t is large enough. */
    verify(uoffset_size > voffset_size || vend >= vbase, flatcc_verify_error_vtable_size_overflow);

    verify(td.vsize >= 2 * voffset_size, flatcc_verify_error_vtable_header_too_small);
    /* Read table size. */
    td.tsize = read_voffset(buf, vbase + voffset_size);
    verify(end - td.table >= td.tsize, flatcc_verify_error_table_size_out_of_range);
    td.vtable = (uint8_t *)buf + vbase;
    td.buf = buf;
    td.end = end;
    return tvf(&td);
}